

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drumtab.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_t __n;
  void *__buf;
  MidiFile outputfile;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  MidiFile local_80;
  
  smf::MidiFile::MidiFile(&local_80);
  smf::MidiFile::absoluteTicks(&local_80);
  smf::MidiFile::setTicksPerQuarterNote(&local_80,0x78);
  AddDrumTrack(&local_80,(int *)&DAT_0011b010,0x3b,0x1e);
  AddDrumTrack(&local_80,(int *)&DAT_0011b0e0,0x26,0x1e);
  __n = 0x1e;
  AddDrumTrack(&local_80,(int *)&DAT_0011b1b0,0x29,0x1e);
  smf::MidiFile::sortTracks(&local_80);
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"rhythm.mid","");
  smf::MidiFile::write(&local_80,(int)local_a0,__buf,__n);
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  smf::MidiFile::~MidiFile(&local_80);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
   MidiFile outputfile;        // create an empty MIDI file with one track
   outputfile.absoluteTicks(); // time information stored as absolute time
                               // (will be coverted to delta time when written)
   outputfile.setTicksPerQuarterNote(QUARTER);

   int hhdata[50] = {'x', '-', 'x', '-', 'x', '-', 'x', '-', -1};
   int sndata[50] = {'-', '-', 'x', '-', '-', '-', 'x', '-', -1};
   int bsdata[50] = {'x', '-', '-', '-', 'x', '-', '-', '-', -1};

   AddDrumTrack(outputfile, hhdata, HIGH_HAT,  SIXTEENTH);
   AddDrumTrack(outputfile, sndata, SNARE,     SIXTEENTH);
   AddDrumTrack(outputfile, bsdata, BASS_DRUM, SIXTEENTH);

   outputfile.sortTracks();         // make sure data is in correct order
   outputfile.write("rhythm.mid");  // write Standard MIDI File twinkle.mid

   return 0;
}